

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
google::anon_unknown_1::CommandLineFlagParser::ValidateAllFlags(CommandLineFlagParser *this)

{
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  char *pcVar4;
  mapped_type *this_00;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [39];
  allocator local_69;
  string local_68 [48];
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_20;
  FlagConstIterator i;
  FlagRegistryLock frl;
  CommandLineFlagParser *this_local;
  
  FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&i,this->registry_);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::begin(&this->registry_->flags_);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
         ::end(&this->registry_->flags_);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
    ::_Rb_tree_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
             ::operator->(&local_20);
    bVar1 = CommandLineFlag::ValidateCurrent(ppVar3->second);
    if (!bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
               ::operator->(&local_20);
      pcVar4 = CommandLineFlag::name(ppVar3->second);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,pcVar4,&local_69);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->error_flags_,(key_type *)local_68);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if ((bVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"ERROR: ",&local_f1);
        std::operator+(local_d0,(char *)local_f0);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
                 ::operator->(&local_20);
        CommandLineFlag::name(ppVar3->second);
        std::operator+(local_b0,(char *)local_d0);
        std::operator+(local_90,(char *)local_b0);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
                 ::operator->(&local_20);
        pcVar4 = CommandLineFlag::name(ppVar3->second);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,pcVar4,&local_119);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->error_flags_,(key_type *)local_118);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_90);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)local_b0);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
    ::operator++(&local_20);
  }
  FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&i);
  return;
}

Assistant:

void CommandLineFlagParser::ValidateAllFlags() {
  FlagRegistryLock frl(registry_);
  for (FlagRegistry::FlagConstIterator i = registry_->flags_.begin();
       i != registry_->flags_.end(); ++i) {
    if (!i->second->ValidateCurrent()) {
      // only set a message if one isn't already there.  (If there's
      // an error message, our job is done, even if it's not exactly
      // the same error.)
      if (error_flags_[i->second->name()].empty())
        error_flags_[i->second->name()] =
            string(kError) + "--" + i->second->name() +
            " must be set on the commandline"
            " (default value fails validation)\n";
    }
  }
}